

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  TestNetworkAdapter *pTVar1;
  bool bVar2;
  undefined7 extraout_var;
  TaskSet *this_00;
  ssize_t extraout_RAX;
  ConnectionImpl *func;
  undefined1 local_80 [32];
  Promise<void> local_60;
  ConnectionImpl *local_50;
  ConnectionImpl *connectionPtr;
  Array<capnp::word> local_38;
  undefined1 local_20 [8];
  Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
  incomingMessage;
  OutgoingRpcMessageImpl *this_local;
  ssize_t sVar3;
  
  incomingMessage.ptr = (IncomingRpcMessageImpl *)this;
  bVar2 = kj::Maybe<kj::Exception>::operator!=(&this->connection->networkException,(void *)0x0);
  sVar3 = CONCAT71(extraout_var,bVar2);
  if (!bVar2) {
    pTVar1 = this->connection->network;
    pTVar1->sent = pTVar1->sent + 1;
    messageToFlatArray(&local_38,&(this->message).super_MessageBuilder);
    kj::
    heap<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl,kj::Array<capnp::word>>
              ((kj *)local_20,&local_38);
    kj::Array<capnp::word>::~Array(&local_38);
    func = this->connection;
    local_50 = func;
    this_00 = kj::Own<kj::TaskSet>::operator->(&this->connection->tasks);
    local_80._0_8_ = local_50;
    kj::
    mvCapture<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)_1_,kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&>
              ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
                *)(local_80 + 8),(kj *)local_20,
               (Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
                *)local_80,(Type *)func);
    kj::
    evalLater<kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)_1_,kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>>
              ((kj *)&local_60,
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
                *)(local_80 + 8));
    kj::TaskSet::add(this_00,&local_60);
    kj::Promise<void>::~Promise(&local_60);
    kj::
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
    ::~CaptureByMove((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
                      *)(local_80 + 8));
    kj::
    Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
    ::~Own((Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
            *)local_20);
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

void send() override {
        if (connection.networkException != nullptr) {
          return;
        }

        ++connection.network.sent;

        // Uncomment to get a debug dump.
//        kj::String msg = connection.network.network.dumper.dump(
//            message.getRoot<rpc::Message>(), connection.sender);
//        KJ_ DBG(msg);

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        auto connectionPtr = &connection;
        connection.tasks->add(kj::evalLater(kj::mvCapture(incomingMessage,
            [connectionPtr](kj::Own<IncomingRpcMessageImpl>&& message) {
          KJ_IF_MAYBE(p, connectionPtr->partner) {
            if (p->fulfillers.empty()) {
              p->messages.push(kj::mv(message));
            } else {
              ++p->network.received;
              p->fulfillers.front()->fulfill(
                  kj::Own<IncomingRpcMessage>(kj::mv(message)));
              p->fulfillers.pop();
            }
          }
        })));
      }